

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_scientific.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::ScientificMatcher::ScientificMatcher
          (ScientificMatcher *this,DecimalFormatSymbols *dfs,Grouper *grouper)

{
  UBool UVar1;
  UnicodeString *pUVar2;
  UnicodeSet *pUVar3;
  UnicodeString *plusSign;
  UnicodeString *minusSign;
  Grouper *grouper_local;
  DecimalFormatSymbols *dfs_local;
  ScientificMatcher *this_local;
  
  NumberParseMatcher::NumberParseMatcher(&this->super_NumberParseMatcher);
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__ScientificMatcher_005bf4e8;
  pUVar2 = DecimalFormatSymbols::getConstSymbol(dfs,kExponentialSymbol);
  icu_63::UnicodeString::UnicodeString(&this->fExponentSeparatorString,pUVar2);
  DecimalMatcher::DecimalMatcher(&this->fExponentMatcher,dfs,grouper,0x30);
  icu_63::UnicodeString::UnicodeString(&this->fCustomMinusSign);
  icu_63::UnicodeString::UnicodeString(&this->fCustomPlusSign);
  pUVar2 = DecimalFormatSymbols::getConstSymbol(dfs,kMinusSignSymbol);
  pUVar3 = anon_unknown.dwarf_22b276::minusSignSet();
  UVar1 = UnicodeSet::contains(pUVar3,pUVar2);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::operator=(&this->fCustomMinusSign,pUVar2);
  }
  else {
    icu_63::UnicodeString::setToBogus(&this->fCustomMinusSign);
  }
  pUVar2 = DecimalFormatSymbols::getConstSymbol(dfs,kPlusSignSymbol);
  pUVar3 = anon_unknown.dwarf_22b276::plusSignSet();
  UVar1 = UnicodeSet::contains(pUVar3,pUVar2);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::operator=(&this->fCustomPlusSign,pUVar2);
  }
  else {
    icu_63::UnicodeString::setToBogus(&this->fCustomPlusSign);
  }
  return;
}

Assistant:

ScientificMatcher::ScientificMatcher(const DecimalFormatSymbols& dfs, const Grouper& grouper)
        : fExponentSeparatorString(dfs.getConstSymbol(DecimalFormatSymbols::kExponentialSymbol)),
          fExponentMatcher(dfs, grouper, PARSE_FLAG_INTEGER_ONLY | PARSE_FLAG_GROUPING_DISABLED) {

    const UnicodeString& minusSign = dfs.getConstSymbol(DecimalFormatSymbols::kMinusSignSymbol);
    if (minusSignSet().contains(minusSign)) {
        fCustomMinusSign.setToBogus();
    } else {
        fCustomMinusSign = minusSign;
    }

    const UnicodeString& plusSign = dfs.getConstSymbol(DecimalFormatSymbols::kPlusSignSymbol);
    if (plusSignSet().contains(plusSign)) {
        fCustomPlusSign.setToBogus();
    } else {
        fCustomPlusSign = plusSign;
    }
}